

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Block,_char> *b)

{
  ostream *poVar1;
  JObject *pJVar2;
  JObject local_30;
  char local_1a [2];
  
  local_30.sep = "";
  local_30.os = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  local_1a[0] = '\0';
  pJVar2 = JObject::field<char[7],unsigned_long,char>
                     (&local_30,(char (*) [7])0x167699,&b->object->offset,local_1a);
  local_1a[1] = 0;
  pJVar2 = JObject::field<char[7],unsigned_long,char>
                     (pJVar2,(char (*) [7])0x167841,&b->object->length,local_1a + 1);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_30);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Block> &b)
{
    return JObject(os)
        .field("offset", b.object.offset)
        .field("length", b.object.length);
}